

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TessellationTests::init(TessellationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  _func_int **pp_Var2;
  char *name;
  _Alloc_hider _Var3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  int extraout_EAX;
  TestNode *pTVar7;
  TestNode *pTVar8;
  undefined8 *puVar9;
  long *plVar10;
  long lVar11;
  TestNode *pTVar12;
  BasicVariousTessLevelsPosAttrCase *pBVar13;
  undefined8 extraout_RAX;
  undefined8 uVar14;
  TestNode *pTVar15;
  TestNode *this_00;
  UserDefinedIOCase *pUVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_type *psVar18;
  long *plVar19;
  ulong *puVar20;
  TestNode **ppTVar21;
  char *pcVar22;
  undefined **ppuVar23;
  bool bVar24;
  uint uVar25;
  TessPrimitiveType TVar26;
  undefined4 uVar27;
  int *piVar28;
  int spacingI;
  SpacingMode SVar29;
  ulong uVar30;
  undefined1 uVar31;
  int iVar32;
  long lVar33;
  string primSpacName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string caseName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string caseName;
  TestNode **in_stack_fffffffffffffcb8;
  TestNode **ppTVar34;
  TestNode *local_338;
  long lStack_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  TestNode *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  BasicVariousTessLevelsPosAttrCase *local_2e0;
  ulong *puStack_2d8;
  long lStack_2d0;
  ulong uStack_2c8;
  long lStack_2c0;
  TestNode *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  TestNode *local_290;
  ulong *puStack_288;
  long lStack_280;
  ulong uStack_278;
  long lStack_270;
  TestNode *pTStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  UserDefinedIOCase *pUStack_220;
  ulong uStack_218;
  TestNode *pTStack_210;
  TestNode *pTStack_208;
  ulong *puStack_200;
  long lStack_1f8;
  ulong uStack_1f0;
  long lStack_1e8;
  TestNode *pTStack_1e0;
  TestNode *pTStack_1d8;
  undefined1 *puStack_1d0;
  undefined8 uStack_1c8;
  undefined1 uStack_1c0;
  undefined7 uStack_1bf;
  TestNode *pTStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "Query tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_patch_vertices","Test MAX_PATCH_VERTICES");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x2000008e7d;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_gen_level","Test MAX_TESS_GEN_LEVEL");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x4000008e7e;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_uniform_components",
             "Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x40000008e7f;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_uniform_components",
             "Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x40000008e80;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_texture_image_units",
             "Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x1000008e81;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_texture_image_units",
             "Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x1000008e82;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_output_components",
             "Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x4000008e83;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_patch_components",
             "Test MAX_TESS_PATCH_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x7800008e84;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_total_output_components",
             "Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x80000008e85;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_output_components",
             "Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x4000008e86;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_uniform_blocks",
             "Test MAX_TESS_CONTROL_UNIFORM_BLOCKS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0xc00008e89;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_uniform_blocks",
             "Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0xc00008e8a;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_input_components",
             "Test MAX_TESS_CONTROL_INPUT_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x400000886c;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_input_components",
             "Test MAX_TESS_EVALUATION_INPUT_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x400000886d;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_atomic_counter_buffers",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x92cd;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_atomic_counter_buffers",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x92ce;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_atomic_counters",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTERS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x92d3;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_atomic_counters",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x92d4;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_image_uniforms",
             "Test MAX_TESS_CONTROL_IMAGE_UNIFORMS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x90cb;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_image_uniforms",
             "Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x90cc;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_control_shader_storage_blocks",
             "Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x90d8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_tess_evaluation_shader_storage_blocks",
             "Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x90d9;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_uniform_buffer_bindings",
             "Test MAX_UNIFORM_BUFFER_BINDINGS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x4800008a2f;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_combined_uniform_blocks",
             "Test MAX_COMBINED_UNIFORM_BLOCKS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x3c00008a2e;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_combined_texture_image_units",
             "Test MAX_COMBINED_TEXTURE_IMAGE_UNITS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b292e8;
  pTVar8[1].m_testCtx = (TestContext *)0x6000008b4d;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_combined_tess_control_uniform_components",
             "Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29338;
  pTVar8[1].m_testCtx = (TestContext *)0x8e8900008e1e;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0x8e7f;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"max_combined_tess_evaluation_uniform_components",
             "Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29338;
  pTVar8[1].m_testCtx = (TestContext *)0x8e8a00008e1f;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0x8e80;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"primitive_restart_for_patches_supported",
             "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29388;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"patch_vertices","Test PATCH_VERTICES");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b293d8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"tess_control_output_vertices",
             "Test TESS_CONTROL_OUTPUT_VERTICES");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29428;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar8,pCVar1->m_testCtx,"tess_gen_mode","Test TESS_GEN_MODE")
  ;
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29490;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"tess_gen_spacing","Test TESS_GEN_SPACING");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29528;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"tess_gen_vertex_order",
             "Test TESS_GEN_VERTEX_ORDER");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b295e0;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"tess_gen_point_mode","Test TESS_GEN_POINT_MODE");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29678;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"referenced_by_tess_control_shader",
             "Test REFERENCED_BY_TESS_CONTROL_SHADER");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29700;
  *(undefined1 *)&pTVar8[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar1->m_testCtx,"referenced_by_tess_evaluation_shader",
             "Test REFERENCED_BY_TESS_EVALUATION_SHADER");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29700;
  *(undefined1 *)&pTVar8[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar8,pCVar1->m_testCtx,"is_per_patch","Test IS_PER_PATCH");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b29750;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar1->m_testCtx,"tesscoord",
             "Get tessellation coordinates with transform feedback and validate them");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar1;
  local_308 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pBVar13 = (BasicVariousTessLevelsPosAttrCase *)0x0;
  local_2b8 = (TestNode *)this;
  do {
    iVar32 = 0;
    local_2e0 = pBVar13;
    do {
      pTVar7 = (TestNode *)operator_new(0x90);
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_260 = &local_250;
      local_258 = 0;
      local_250 = local_250 & 0xffffffffffffff00;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      psVar18 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2b0.field_2._M_allocated_capacity = *psVar18;
        local_2b0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar18;
        local_2b0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_2b0._M_string_length = puVar9[1];
      *puVar9 = psVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_240.field_2._M_allocated_capacity = *psVar18;
        local_240.field_2._8_8_ = plVar10[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar18;
        local_240._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_240._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_1a8 = &local_198;
      plVar19 = plVar10 + 2;
      if ((long *)*plVar10 == plVar19) {
        local_198 = *plVar19;
        lStack_190 = plVar10[3];
      }
      else {
        local_198 = *plVar19;
        local_1a8 = (long *)*plVar10;
      }
      local_1a0 = plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar7,pCVar1->m_testCtx,(char *)local_1a8,
                 SSBOArrayLengthTests::init::arraysSized + 1);
      pTVar7[1]._vptr_TestNode = (_func_int **)pCVar1;
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__TessCoordCase_00b297a0;
      *(int *)&pTVar7[1].m_testCtx = (int)pBVar13;
      *(int *)((long)&pTVar7[1].m_testCtx + 4) = iVar32;
      pTVar7[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar7[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild(local_308,pTVar7);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      this = (TessellationTests *)local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      iVar32 = iVar32 + 1;
    } while (iVar32 != 3);
    uVar25 = (int)pBVar13 + 1;
    pBVar13 = (BasicVariousTessLevelsPosAttrCase *)(ulong)uVar25;
  } while (uVar25 != 3);
  pTVar7 = (TestNode *)operator_new(0x78);
  pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"winding",
             "Test the cw and ccw input layout qualifiers");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar7[1]._vptr_TestNode = pp_Var2;
  local_308 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  uVar25 = 0;
  do {
    if (uVar25 == 2) break;
    local_2e0 = (BasicVariousTessLevelsPosAttrCase *)(ulong)uVar25;
    uVar27 = 0;
    bVar5 = true;
    do {
      bVar24 = bVar5;
      pTVar7 = (TestNode *)operator_new(0x90);
      pCVar1 = (Context *)local_2b8[1]._vptr_TestNode;
      local_260 = &local_250;
      local_258 = 0;
      local_250 = local_250 & 0xffffffffffffff00;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      psVar18 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2b0.field_2._M_allocated_capacity = *psVar18;
        local_2b0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar18;
        local_2b0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_2b0._M_string_length = puVar9[1];
      *puVar9 = psVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_240.field_2._M_allocated_capacity = *psVar18;
        local_240.field_2._8_8_ = plVar10[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar18;
        local_240._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_240._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_1a8 = &local_198;
      plVar19 = plVar10 + 2;
      if ((long *)*plVar10 == plVar19) {
        local_198 = *plVar19;
        lStack_190 = plVar10[3];
      }
      else {
        local_198 = *plVar19;
        local_1a8 = (long *)*plVar10;
      }
      local_1a0 = plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar7,pCVar1->m_testCtx,(char *)local_1a8,
                 SSBOArrayLengthTests::init::arraysSized + 1);
      pTVar7[1]._vptr_TestNode = (_func_int **)pCVar1;
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__WindingCase_00b297f0;
      *(uint *)&pTVar7[1].m_testCtx = uVar25;
      *(undefined4 *)((long)&pTVar7[1].m_testCtx + 4) = uVar27;
      pTVar7[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar7[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild(local_308,pTVar7);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      uVar27 = 1;
      bVar5 = false;
    } while (bVar24);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  pTVar8 = (TestNode *)operator_new(0x78);
  pTVar7 = local_2b8;
  pp_Var2 = local_2b8[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,(TestContext *)*pp_Var2,"shader_input_output",
             "Test tessellation control and evaluation shader inputs and outputs");
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar8[1]._vptr_TestNode = pp_Var2;
  local_308 = pTVar8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  lVar11 = 0;
  bVar5 = true;
  do {
    bVar24 = bVar5;
    iVar32 = init::patchVertexCountCases[lVar11].inPatchSize;
    local_2e0 = (BasicVariousTessLevelsPosAttrCase *)
                CONCAT44(local_2e0._4_4_,init::patchVertexCountCases[lVar11].outPatchSize);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    local_290 = (TestNode *)CONCAT44(local_290._4_4_,iVar32);
    std::ostream::operator<<((ostringstream *)&local_1a8,iVar32);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&stack0xfffffffffffffcb8,0,(char *)0x0,0x97518d);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    psVar18 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_300.field_2._M_allocated_capacity = *psVar18;
      local_300.field_2._8_8_ = plVar10[3];
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar18;
      local_300._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_300._M_string_length = plVar10[1];
    *plVar10 = (long)psVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_260 = &local_250;
    puVar20 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar20) {
      local_250 = *puVar20;
      lStack_248 = plVar10[3];
    }
    else {
      local_250 = *puVar20;
      local_260 = (ulong *)*plVar10;
    }
    local_258 = plVar10[1];
    *plVar10 = (long)puVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(IOType)local_2e0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar30 = 0xf;
    if (local_260 != &local_250) {
      uVar30 = local_250;
    }
    if (uVar30 < local_328._M_string_length + local_258) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        uVar14 = local_328.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_328._M_string_length + local_258) goto LAB_003b65a0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)local_260);
    }
    else {
LAB_003b65a0:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_328._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    psVar18 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_2b0.field_2._M_allocated_capacity = *psVar18;
      local_2b0.field_2._8_8_ = puVar9[3];
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar18;
      local_2b0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_2b0._M_string_length = puVar9[1];
    *puVar9 = psVar18;
    puVar9[1] = 0;
    *(undefined1 *)psVar18 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    psVar18 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_240.field_2._M_allocated_capacity = *psVar18;
      local_240.field_2._8_8_ = plVar10[3];
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar18;
      local_240._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_240._M_string_length = plVar10[1];
    *plVar10 = (long)psVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (in_stack_fffffffffffffcb8 != &local_338) {
      operator_delete(in_stack_fffffffffffffcb8,(ulong)((long)&local_338->_vptr_TestNode + 1));
    }
    pTVar8 = (TestNode *)operator_new(0xb0);
    _Var3._M_p = local_240._M_dataplus._M_p;
    pp_Var2 = pTVar7[1]._vptr_TestNode;
    std::operator+(&local_2b0,"data/tessellation/",&local_240);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    plVar19 = plVar10 + 2;
    if ((long *)*plVar10 == plVar19) {
      local_198 = *plVar19;
      lStack_190 = plVar10[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar19;
      local_1a8 = (long *)*plVar10;
    }
    plVar4 = local_1a8;
    local_1a0 = plVar10[1];
    *plVar10 = (long)plVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar8,(TestContext *)*pp_Var2,_Var3._M_p,
               "Test input and output patch vertex counts");
    pTVar8[1]._vptr_TestNode = pp_Var2;
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__PatchVertexCountCase_00b29840;
    *(undefined4 *)&pTVar8[1].m_testCtx = local_290._0_4_;
    *(IOType *)((long)&pTVar8[1].m_testCtx + 4) = (IOType)local_2e0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pTVar8[1].m_name,(char *)plVar4,(allocator<char> *)&local_260);
    pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar8[1].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_308,pTVar8);
    pTVar7 = local_2b8;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    lVar11 = 1;
    iVar32 = 0;
    bVar5 = false;
  } while (bVar24);
  do {
    pTVar8 = (TestNode *)operator_new(0xb0);
    local_2e0 = (BasicVariousTessLevelsPosAttrCase *)0x952fc1;
    pp_Var2 = pTVar7[1]._vptr_TestNode;
    local_260 = &local_250;
    local_258 = 0;
    local_250 = local_250 & 0xffffffffffffff00;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    psVar18 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_2b0.field_2._M_allocated_capacity = *psVar18;
      local_2b0.field_2._8_8_ = puVar9[3];
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar18;
      local_2b0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_2b0._M_string_length = puVar9[1];
    *puVar9 = psVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    psVar18 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_240.field_2._M_allocated_capacity = *psVar18;
      local_240.field_2._8_8_ = plVar10[3];
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar18;
      local_240._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_240._M_string_length = plVar10[1];
    *plVar10 = (long)psVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_1a8 = &local_198;
    plVar19 = plVar10 + 2;
    if ((long *)*plVar10 == plVar19) {
      local_198 = *plVar19;
      lStack_190 = plVar10[3];
    }
    else {
      local_198 = *plVar19;
      local_1a8 = (long *)*plVar10;
    }
    plVar4 = local_1a8;
    local_1a0 = plVar10[1];
    *plVar10 = (long)plVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar8,(TestContext *)*pp_Var2,"primitive_id_tcs",(char *)local_2e0);
    pTVar8[1]._vptr_TestNode = pp_Var2;
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__PerPatchDataCase_00b29890;
    *(int *)&pTVar8[1].m_testCtx = iVar32;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pTVar8[1].m_name,(char *)plVar4,(allocator<char> *)&local_300);
    pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar8[1].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_308,pTVar8);
    pTVar7 = local_2b8;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    iVar32 = iVar32 + 1;
  } while (iVar32 != 10);
  iVar32 = 0;
  piVar28 = &DAT_0094ff18;
  do {
    iVar6 = *piVar28;
    pTVar7 = (TestNode *)operator_new(0xb0);
    pp_Var2 = local_2b8[1]._vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar7,(TestContext *)*pp_Var2,
               (char *)((long)&DAT_0094ff18 + (long)iVar6),
               SSBOArrayLengthTests::init::arraysSized + 1);
    pTVar7[1]._vptr_TestNode = pp_Var2;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__GLPositionCase_00b298e0;
    *(int *)&pTVar7[1].m_testCtx = iVar32;
    pTVar7[1].m_name._M_dataplus._M_p = (pointer)&pTVar7[1].m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pTVar7[1].m_name,"data/tessellation/gl_position_ref.png","");
    pTVar7[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar7[1].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_308,pTVar7);
    iVar32 = iVar32 + 1;
    piVar28 = piVar28 + 1;
  } while (iVar32 != 3);
  pTVar12 = (TestNode *)operator_new(0xa8);
  pTVar8 = local_2b8;
  pp_Var2 = local_2b8[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,(TestContext *)*pp_Var2,"barrier","Basic barrier usage");
  pTVar7 = local_308;
  pTVar12[1]._vptr_TestNode = pp_Var2;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__BarrierCase_00b29930;
  pTVar12[1].m_testCtx = (TestContext *)&pTVar12[1].m_name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&pTVar12[1].m_testCtx,"data/tessellation/barrier_ref.png","");
  *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
  pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar7,pTVar12);
  pTVar7 = (TestNode *)operator_new(0x78);
  pp_Var2 = pTVar8[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"misc_draw",
             "Miscellaneous draw-result-verifying cases");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar7[1]._vptr_TestNode = pp_Var2;
  tcu::TestNode::addChild(pTVar8,pTVar7);
  TVar26 = TESSPRIMITIVETYPE_TRIANGLES;
  local_308 = pTVar7;
  do {
    pTStack_268 = (TestNode *)0x947719;
    if (TVar26 != TESSPRIMITIVETYPE_TRIANGLES) {
      if (TVar26 != TESSPRIMITIVETYPE_QUADS) break;
      pTStack_268 = (TestNode *)0x951f0f;
    }
    SVar29 = SPACINGMODE_EQUAL;
    ppuVar23 = &PTR_anon_var_dwarf_2561a7_00b2a148;
    do {
      puStack_288 = &uStack_278;
      lStack_280 = 0;
      uStack_278 = uStack_278 & 0xffffffffffffff00;
      plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_288);
      puStack_2d8 = &uStack_2c8;
      puVar20 = (ulong *)(plVar10 + 2);
      if ((ulong *)*plVar10 == puVar20) {
        uStack_2c8 = *puVar20;
        lStack_2c0 = plVar10[3];
      }
      else {
        uStack_2c8 = *puVar20;
        puStack_2d8 = (ulong *)*plVar10;
      }
      lStack_2d0 = plVar10[1];
      *plVar10 = (long)puVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      puVar20 = (ulong *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = plVar10[3];
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_328._M_string_length = plVar10[1];
      *plVar10 = (long)puVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
      ppTVar34 = &local_338;
      ppTVar21 = (TestNode **)(plVar10 + 2);
      if ((TestNode **)*plVar10 == ppTVar21) {
        local_338 = *ppTVar21;
        lStack_330 = plVar10[3];
      }
      else {
        local_338 = *ppTVar21;
        ppTVar34 = (TestNode **)*plVar10;
      }
      *plVar10 = (long)ppTVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcb8);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_300.field_2._M_allocated_capacity = *psVar18;
        local_300.field_2._8_8_ = plVar10[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar18;
        local_300._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_300._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (ppTVar34 != &local_338) {
        operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (puStack_2d8 != &uStack_2c8) {
        operator_delete(puStack_2d8,uStack_2c8 + 1);
      }
      if (puStack_288 != &uStack_278) {
        operator_delete(puStack_288,uStack_278 + 1);
      }
      local_2e0 = (BasicVariousTessLevelsPosAttrCase *)operator_new(0xb0);
      _Var3._M_p = local_300._M_dataplus._M_p;
      pCVar1 = (Context *)pTVar8[1]._vptr_TestNode;
      local_290 = (TestNode *)ppuVar23;
      std::operator+(&local_328,"data/tessellation/",&local_300);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
      pBVar13 = local_2e0;
      ppTVar34 = &local_338;
      ppTVar21 = (TestNode **)(plVar10 + 2);
      if ((TestNode **)*plVar10 == ppTVar21) {
        local_338 = *ppTVar21;
        lStack_330 = plVar10[3];
      }
      else {
        local_338 = *ppTVar21;
        ppTVar34 = (TestNode **)*plVar10;
      }
      *plVar10 = (long)ppTVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      anon_unknown_1::BasicVariousTessLevelsPosAttrCase::BasicVariousTessLevelsPosAttrCase
                (local_2e0,pCVar1,_Var3._M_p,
                 "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                 ,TVar26,SVar29,(char *)ppTVar34);
      (pBVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_00b29980;
      tcu::TestNode::addChild(local_308,(TestNode *)pBVar13);
      if (ppTVar34 != &local_338) {
        operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
      }
      pTVar7 = local_290;
      pTVar8 = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      SVar29 = SVar29 + SPACINGMODE_FRACTIONAL_ODD;
      ppuVar23 = (undefined **)((long)pTVar7 + 8);
    } while (SVar29 != SPACINGMODE_LAST);
    TVar26 = TVar26 + TESSPRIMITIVETYPE_QUADS;
  } while (TVar26 != TESSPRIMITIVETYPE_LAST);
  TVar26 = TESSPRIMITIVETYPE_TRIANGLES;
  do {
    pTStack_268 = (TestNode *)0x947719;
    if (TVar26 != TESSPRIMITIVETYPE_TRIANGLES) {
      if (TVar26 != TESSPRIMITIVETYPE_QUADS) break;
      pTStack_268 = (TestNode *)0x951f0f;
    }
    SVar29 = SPACINGMODE_EQUAL;
    ppuVar23 = &PTR_anon_var_dwarf_2561a7_00b2a148;
    do {
      puStack_288 = &uStack_278;
      lStack_280 = 0;
      uStack_278 = uStack_278 & 0xffffffffffffff00;
      plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_288);
      puStack_2d8 = &uStack_2c8;
      puVar20 = (ulong *)(plVar10 + 2);
      if ((ulong *)*plVar10 == puVar20) {
        uStack_2c8 = *puVar20;
        lStack_2c0 = plVar10[3];
      }
      else {
        uStack_2c8 = *puVar20;
        puStack_2d8 = (ulong *)*plVar10;
      }
      lStack_2d0 = plVar10[1];
      *plVar10 = (long)puVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      puVar20 = (ulong *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = plVar10[3];
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_328._M_string_length = plVar10[1];
      *plVar10 = (long)puVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
      ppTVar34 = &local_338;
      ppTVar21 = (TestNode **)(plVar10 + 2);
      if ((TestNode **)*plVar10 == ppTVar21) {
        local_338 = *ppTVar21;
        lStack_330 = plVar10[3];
      }
      else {
        local_338 = *ppTVar21;
        ppTVar34 = (TestNode **)*plVar10;
      }
      *plVar10 = (long)ppTVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcb8);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_300.field_2._M_allocated_capacity = *psVar18;
        local_300.field_2._8_8_ = plVar10[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar18;
        local_300._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_300._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (ppTVar34 != &local_338) {
        operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (puStack_2d8 != &uStack_2c8) {
        operator_delete(puStack_2d8,uStack_2c8 + 1);
      }
      if (puStack_288 != &uStack_278) {
        operator_delete(puStack_288,uStack_278 + 1);
      }
      local_2e0 = (BasicVariousTessLevelsPosAttrCase *)operator_new(0xb0);
      _Var3._M_p = local_300._M_dataplus._M_p;
      pCVar1 = (Context *)pTVar8[1]._vptr_TestNode;
      local_290 = (TestNode *)ppuVar23;
      std::operator+(&local_328,"data/tessellation/",&local_300);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
      pBVar13 = local_2e0;
      ppTVar34 = &local_338;
      ppTVar21 = (TestNode **)(plVar10 + 2);
      if ((TestNode **)*plVar10 == ppTVar21) {
        local_338 = *ppTVar21;
        lStack_330 = plVar10[3];
      }
      else {
        local_338 = *ppTVar21;
        ppTVar34 = (TestNode **)*plVar10;
      }
      *plVar10 = (long)ppTVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      anon_unknown_1::BasicVariousTessLevelsPosAttrCase::BasicVariousTessLevelsPosAttrCase
                (local_2e0,pCVar1,_Var3._M_p,
                 "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                 ,TVar26,SVar29,(char *)ppTVar34);
      (pBVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_00b29a30;
      tcu::TestNode::addChild(local_308,(TestNode *)pBVar13);
      if (ppTVar34 != &local_338) {
        operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
      }
      pTVar7 = local_290;
      pTVar8 = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      SVar29 = SVar29 + SPACINGMODE_FRACTIONAL_ODD;
      ppuVar23 = (undefined **)((long)pTVar7 + 8);
    } while (SVar29 != SPACINGMODE_LAST);
    TVar26 = TVar26 + TESSPRIMITIVETYPE_QUADS;
  } while (TVar26 != TESSPRIMITIVETYPE_LAST);
  SVar29 = SPACINGMODE_EQUAL;
  do {
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_328._M_string_length = 0;
    local_328.field_2._M_allocated_capacity =
         local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
    ppTVar34 = &local_338;
    ppTVar21 = (TestNode **)(plVar10 + 2);
    if ((TestNode **)*plVar10 == ppTVar21) {
      local_338 = *ppTVar21;
      lStack_330 = plVar10[3];
    }
    else {
      local_338 = *ppTVar21;
      ppTVar34 = (TestNode **)*plVar10;
    }
    *plVar10 = (long)ppTVar21;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcb8);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    psVar18 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_300.field_2._M_allocated_capacity = *psVar18;
      local_300.field_2._8_8_ = plVar10[3];
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar18;
      local_300._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_300._M_string_length = plVar10[1];
    *plVar10 = (long)psVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if (ppTVar34 != &local_338) {
      operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    pBVar13 = (BasicVariousTessLevelsPosAttrCase *)operator_new(0xb0);
    _Var3._M_p = local_300._M_dataplus._M_p;
    pCVar1 = (Context *)pTVar8[1]._vptr_TestNode;
    std::operator+(&local_328,"data/tessellation/",&local_300);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
    ppTVar34 = &local_338;
    ppTVar21 = (TestNode **)(plVar10 + 2);
    if ((TestNode **)*plVar10 == ppTVar21) {
      local_338 = *ppTVar21;
      lStack_330 = plVar10[3];
    }
    else {
      local_338 = *ppTVar21;
      ppTVar34 = (TestNode **)*plVar10;
    }
    *plVar10 = (long)ppTVar21;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    anon_unknown_1::BasicVariousTessLevelsPosAttrCase::BasicVariousTessLevelsPosAttrCase
              (pBVar13,pCVar1,_Var3._M_p,"Basic isolines render test",TESSPRIMITIVETYPE_ISOLINES,
               SVar29,(char *)ppTVar34);
    (pBVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_00b29a88;
    tcu::TestNode::addChild(local_308,(TestNode *)pBVar13);
    pTVar8 = local_2b8;
    if (ppTVar34 != &local_338) {
      operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    SVar29 = SVar29 + SPACINGMODE_FRACTIONAL_ODD;
  } while (SVar29 != SPACINGMODE_LAST);
  pTVar7 = (TestNode *)operator_new(0x78);
  pp_Var2 = pTVar8[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"common_edge",
             "Draw multiple adjacent shapes and check that no cracks appear between them");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar7[1]._vptr_TestNode = pp_Var2;
  local_2e0 = (BasicVariousTessLevelsPosAttrCase *)pTVar7;
  tcu::TestNode::addChild(pTVar8,pTVar7);
  local_308 = (TestNode *)0x0;
  uVar14 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  do {
    pTStack_268 = (TestNode *)CONCAT44(pTStack_268._4_4_,(int)uVar14);
    uVar25 = 0;
    do {
      if (uVar25 == 2) break;
      local_290 = (TestNode *)(ulong)uVar25;
      iVar32 = 0;
      do {
        puStack_288 = &uStack_278;
        lStack_280 = 0;
        uStack_278 = uStack_278 & 0xffffffffffffff00;
        plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_288);
        puStack_2d8 = &uStack_2c8;
        puVar20 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar20) {
          uStack_2c8 = *puVar20;
          lStack_2c0 = plVar10[3];
        }
        else {
          uStack_2c8 = *puVar20;
          puStack_2d8 = (ulong *)*plVar10;
        }
        lStack_2d0 = plVar10[1];
        *plVar10 = (long)puVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar20 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = plVar10[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_328._M_string_length = plVar10[1];
        *plVar10 = (long)puVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
        ppTVar34 = &local_338;
        ppTVar21 = (TestNode **)(plVar10 + 2);
        if ((TestNode **)*plVar10 == ppTVar21) {
          local_338 = *ppTVar21;
          lStack_330 = plVar10[3];
        }
        else {
          local_338 = *ppTVar21;
          ppTVar34 = (TestNode **)*plVar10;
        }
        *plVar10 = (long)ppTVar21;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcb8);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        psVar18 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_300.field_2._M_allocated_capacity = *psVar18;
          local_300.field_2._8_8_ = plVar10[3];
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar18;
          local_300._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_300._M_string_length = plVar10[1];
        *plVar10 = (long)psVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if (ppTVar34 != &local_338) {
          operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if (puStack_2d8 != &uStack_2c8) {
          operator_delete(puStack_2d8,uStack_2c8 + 1);
        }
        if (puStack_288 != &uStack_278) {
          operator_delete(puStack_288,uStack_278 + 1);
        }
        pTVar7 = (TestNode *)operator_new(0x98);
        pp_Var2 = pTVar8[1]._vptr_TestNode;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,(TestContext *)*pp_Var2,local_300._M_dataplus._M_p,
                   SSBOArrayLengthTests::init::arraysSized + 1);
        pTVar7[1]._vptr_TestNode = pp_Var2;
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__CommonEdgeCase_00b29ae0;
        *(uint *)&pTVar7[1].m_testCtx = uVar25;
        *(int *)((long)&pTVar7[1].m_testCtx + 4) = iVar32;
        *(int *)&pTVar7[1].m_name._M_dataplus._M_p = (int)local_308;
        pTVar7[1].m_name._M_string_length = 0;
        pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
        tcu::TestNode::addChild((TestNode *)local_2e0,pTVar7);
        pTVar8 = local_2b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        iVar32 = iVar32 + 1;
      } while (iVar32 != 3);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 3);
    local_308 = (TestNode *)0x1;
    uVar14 = 0;
    if (((ulong)pTStack_268 & 1) == 0) {
      pTVar7 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"fractional_spacing",
                 "Test fractional spacing modes");
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar7[1]._vptr_TestNode = pp_Var2;
      tcu::TestNode::addChild(pTVar8,pTVar7);
      pTVar12 = (TestNode *)operator_new(0x90);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,(TestContext *)*pp_Var2,"odd",
                 SSBOArrayLengthTests::init::arraysSized + 1);
      pTVar12[1]._vptr_TestNode = pp_Var2;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__FractionalSpacingModeCase_00b29b30;
      *(undefined4 *)&pTVar12[1].m_testCtx = 1;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar12[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild(pTVar7,pTVar12);
      pTVar12 = (TestNode *)operator_new(0x90);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,(TestContext *)*pp_Var2,"even",
                 SSBOArrayLengthTests::init::arraysSized + 1);
      pTVar12[1]._vptr_TestNode = pp_Var2;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__FractionalSpacingModeCase_00b29b30;
      *(undefined4 *)&pTVar12[1].m_testCtx = 2;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar12[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild(pTVar7,pTVar12);
      pTVar7 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"primitive_discard",
                 "Test primitive discard with relevant outer tessellation level <= 0.0");
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar7[1]._vptr_TestNode = pp_Var2;
      pTStack_268 = pTVar7;
      tcu::TestNode::addChild(pTVar8,pTVar7);
      uVar30 = 0;
      do {
        uVar25 = 0;
        local_308 = (TestNode *)uVar30;
        pTStack_210 = (TestNode *)uVar30;
        do {
          pUStack_220 = (UserDefinedIOCase *)(ulong)uVar25;
          pcVar22 = (char *)0x0;
          uVar14 = CONCAT71((uint7)(uint3)(uVar25 >> 8),1);
          local_2e0 = (BasicVariousTessLevelsPosAttrCase *)((ulong)local_2e0 & 0xffffffff00000000);
          do {
            uStack_218 = CONCAT44(uStack_218._4_4_,(int)uVar14);
            if ((char)uVar14 != '\0') {
              pcVar22 = "ccw";
            }
            uVar31 = 0;
            local_290 = (TestNode *)pcVar22;
            bVar5 = true;
            do {
              bVar24 = bVar5;
              pTVar7 = (TestNode *)operator_new(0x98);
              pp_Var2 = pTVar8[1]._vptr_TestNode;
              puStack_1d0 = &uStack_1c0;
              uStack_1c8 = 0;
              uStack_1c0 = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_1d0);
              puStack_200 = &uStack_1f0;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar20) {
                uStack_1f0 = *puVar20;
                lStack_1e8 = plVar10[3];
              }
              else {
                uStack_1f0 = *puVar20;
                puStack_200 = (ulong *)*plVar10;
              }
              lStack_1f8 = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_200);
              puStack_288 = &uStack_278;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar20) {
                uStack_278 = *puVar20;
                lStack_270 = plVar10[3];
              }
              else {
                uStack_278 = *puVar20;
                puStack_288 = (ulong *)*plVar10;
              }
              lStack_280 = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_288);
              puStack_2d8 = &uStack_2c8;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar20) {
                uStack_2c8 = *puVar20;
                lStack_2c0 = plVar10[3];
              }
              else {
                uStack_2c8 = *puVar20;
                puStack_2d8 = (ulong *)*plVar10;
              }
              lStack_2d0 = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar20) {
                local_328.field_2._M_allocated_capacity = *puVar20;
                local_328.field_2._8_8_ = plVar10[3];
              }
              else {
                local_328.field_2._M_allocated_capacity = *puVar20;
                local_328._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_328._M_string_length = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
              ppTVar34 = &local_338;
              ppTVar21 = (TestNode **)(plVar10 + 2);
              if ((TestNode **)*plVar10 == ppTVar21) {
                local_338 = *ppTVar21;
                lStack_330 = plVar10[3];
              }
              else {
                local_338 = *ppTVar21;
                ppTVar34 = (TestNode **)*plVar10;
              }
              *plVar10 = (long)ppTVar21;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcb8);
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              psVar18 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_300.field_2._M_allocated_capacity = *psVar18;
                local_300.field_2._8_8_ = plVar10[3];
              }
              else {
                local_300.field_2._M_allocated_capacity = *psVar18;
                local_300._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_300._M_string_length = plVar10[1];
              *plVar10 = (long)psVar18;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar7,(TestContext *)*pp_Var2,local_300._M_dataplus._M_p,
                         SSBOArrayLengthTests::init::arraysSized + 1);
              pTVar7[1]._vptr_TestNode = pp_Var2;
              pTVar7->_vptr_TestNode = (_func_int **)&PTR__PrimitiveDiscardCase_00b29b80;
              *(int *)&pTVar7[1].m_testCtx = (int)local_308;
              *(uint *)((long)&pTVar7[1].m_testCtx + 4) = uVar25;
              *(IOType *)&pTVar7[1].m_name._M_dataplus._M_p = (IOType)local_2e0;
              *(undefined1 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = uVar31;
              pTVar7[1].m_name._M_string_length = 0;
              pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
              tcu::TestNode::addChild(pTStack_268,pTVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              pTVar8 = local_2b8;
              pTVar7 = local_308;
              if (ppTVar34 != &local_338) {
                operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if (puStack_2d8 != &uStack_2c8) {
                operator_delete(puStack_2d8,uStack_2c8 + 1);
              }
              if (puStack_288 != &uStack_278) {
                operator_delete(puStack_288,uStack_278 + 1);
              }
              if (puStack_200 != &uStack_1f0) {
                operator_delete(puStack_200,uStack_1f0 + 1);
              }
              if (puStack_1d0 != &uStack_1c0) {
                operator_delete(puStack_1d0,CONCAT71(uStack_1bf,uStack_1c0) + 1);
              }
              uVar31 = 1;
              bVar5 = false;
            } while (bVar24);
            local_2e0 = (BasicVariousTessLevelsPosAttrCase *)CONCAT44(local_2e0._4_4_,1);
            pcVar22 = "cw";
            uVar14 = 0;
          } while ((uStack_218 & 1) != 0);
          uVar25 = uVar25 + 1;
        } while (uVar25 != 3);
        uVar25 = (int)pTVar7 + 1;
        uVar30 = (ulong)uVar25;
      } while (uVar25 != 3);
      pTVar7 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"invariance",
                 "Test tessellation invariance rules");
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar7[1]._vptr_TestNode = pp_Var2;
      pTVar12 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var2,"primitive_set",
                 "Test invariance rule #1");
      ((TestNode *)&pTVar12->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170
      ;
      ((TestNode *)&pTVar12[1]._vptr_TestNode)->_vptr_TestNode = pp_Var2;
      pTVar15 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var2,"outer_edge_division",
                 "Test invariance rule #2");
      ((TestNode *)&pTVar15->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170
      ;
      ((TestNode *)&pTVar15[1]._vptr_TestNode)->_vptr_TestNode = pp_Var2;
      pTStack_208 = pTVar15;
      pTVar15 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var2,"outer_edge_symmetry",
                 "Test invariance rule #3");
      ((TestNode *)&pTVar15->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170
      ;
      ((TestNode *)&pTVar15[1]._vptr_TestNode)->_vptr_TestNode = pp_Var2;
      local_290 = pTVar15;
      pTVar15 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var2,"outer_edge_index_independence",
                 "Test invariance rule #4");
      ((TestNode *)&pTVar15->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170
      ;
      ((TestNode *)&pTVar15[1]._vptr_TestNode)->_vptr_TestNode = pp_Var2;
      pTStack_210 = pTVar15;
      pTVar15 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var2,"triangle_set",
                 "Test invariance rule #5");
      ((TestNode *)&pTVar15->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170
      ;
      ((TestNode *)&pTVar15[1]._vptr_TestNode)->_vptr_TestNode = pp_Var2;
      pTStack_1d8 = pTVar15;
      pTVar15 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var2,"inner_triangle_set",
                 "Test invariance rule #6");
      pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar15[1]._vptr_TestNode = pp_Var2;
      this_00 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)this_00,(TestContext *)*pp_Var2,"outer_triangle_set",
                 "Test invariance rule #7");
      ((TestNode *)&this_00->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170
      ;
      ((TestNode *)&this_00[1]._vptr_TestNode)->_vptr_TestNode = pp_Var2;
      local_2e0 = (BasicVariousTessLevelsPosAttrCase *)pTVar12;
      pTStack_1e0 = this_00;
      pTVar12 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var2,"tess_coord_component_range",
                 "Test invariance rule #8, first part");
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar12[1]._vptr_TestNode = pp_Var2;
      pUVar16 = (UserDefinedIOCase *)operator_new(0x78);
      pCVar1 = (Context *)pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pUVar16,pCVar1->m_testCtx,"one_minus_tess_coord_component",
                 "Test invariance rule #8, second part");
      (pUVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00b2a170;
      (pUVar16->super_TestCase).m_context = pCVar1;
      tcu::TestNode::addChild(pTVar8,pTVar7);
      tcu::TestNode::addChild(pTVar7,(TestNode *)local_2e0);
      tcu::TestNode::addChild(pTVar7,pTStack_208);
      tcu::TestNode::addChild(pTVar7,local_290);
      tcu::TestNode::addChild(pTVar7,pTStack_210);
      tcu::TestNode::addChild(pTVar7,pTStack_1d8);
      tcu::TestNode::addChild(pTVar7,pTVar15);
      tcu::TestNode::addChild(pTVar7,pTStack_1e0);
      pTStack_268 = pTVar12;
      tcu::TestNode::addChild(pTVar7,pTVar12);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pUVar16);
      uVar30 = 0;
      pUStack_220 = pUVar16;
      pTStack_1b0 = pTVar15;
      do {
        iVar32 = (int)uVar30;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,(char *)(&DAT_00b2a130)[uVar30],
                   (allocator<char> *)&stack0xfffffffffffffcb8);
        local_308 = (TestNode *)((ulong)local_308 & 0xffffffff00000000);
        do {
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,local_300._M_dataplus._M_p,
                     local_300._M_dataplus._M_p + local_300._M_string_length);
          std::__cxx11::string::append((char *)&local_328);
          pTVar12 = pTStack_1d8;
          pTVar7 = pTStack_208;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
          ppTVar34 = &local_338;
          ppTVar21 = (TestNode **)(plVar10 + 2);
          if ((TestNode **)*plVar10 == ppTVar21) {
            local_338 = *ppTVar21;
            lStack_330 = plVar10[3];
          }
          else {
            local_338 = *ppTVar21;
            ppTVar34 = (TestNode **)*plVar10;
          }
          lVar11 = plVar10[1];
          *plVar10 = (long)ppTVar21;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          paVar17 = &local_328.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar17) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
            paVar17 = extraout_RAX_00;
          }
          if (iVar32 != 2) {
            pTVar15 = (TestNode *)operator_new(0x98);
            pp_Var2 = pTVar8[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar15,(TestContext *)*pp_Var2,(char *)ppTVar34,
                       SSBOArrayLengthTests::init::arraysSized + 1);
            pTVar15[1]._vptr_TestNode = pp_Var2;
            pTVar15->_vptr_TestNode = (_func_int **)&PTR__InvariantOuterEdgeCase_00b29bd0;
            *(int *)&pTVar15[1].m_testCtx = iVar32;
            *(TessPrimitiveType *)((long)&pTVar15[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
            pTVar15[1].m_name._M_dataplus._M_p = (pointer)0x0;
            pTVar15[1].m_name._M_string_length = 0;
            pTVar15[1].m_name.field_2._M_allocated_capacity = 0;
            tcu::TestNode::addChild(pTVar7,pTVar15);
            pTVar7 = (TestNode *)operator_new(0xa0);
            pp_Var2 = pTVar8[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar7,(TestContext *)*pp_Var2,(char *)ppTVar34,
                       SSBOArrayLengthTests::init::arraysSized + 1);
            pTVar7[1]._vptr_TestNode = pp_Var2;
            *(int *)&pTVar7[1].m_testCtx = iVar32;
            *(TessPrimitiveType *)((long)&pTVar7[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
            *(undefined1 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
            *(undefined4 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 2;
            pTVar7[1].m_name._M_string_length = 0;
            pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0;
            pTVar7->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_00b29c20;
            tcu::TestNode::addChild(pTVar12,pTVar7);
            pTVar7 = (TestNode *)operator_new(0xa0);
            pp_Var2 = pTVar8[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar7,(TestContext *)*pp_Var2,(char *)ppTVar34,
                       SSBOArrayLengthTests::init::arraysSized + 1);
            pTVar7[1]._vptr_TestNode = pp_Var2;
            *(int *)&pTVar7[1].m_testCtx = iVar32;
            *(TessPrimitiveType *)((long)&pTVar7[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
            *(undefined1 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
            *(undefined4 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 2;
            pTVar7[1].m_name._M_string_length = 0;
            pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0;
            pTVar7->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_00b29ce0;
            tcu::TestNode::addChild(pTStack_1b0,pTVar7);
            pTVar7 = (TestNode *)operator_new(0xa0);
            pp_Var2 = pTVar8[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar7,(TestContext *)*pp_Var2,(char *)ppTVar34,
                       SSBOArrayLengthTests::init::arraysSized + 1);
            pTVar7[1]._vptr_TestNode = pp_Var2;
            *(int *)&pTVar7[1].m_testCtx = iVar32;
            *(TessPrimitiveType *)((long)&pTVar7[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
            *(undefined1 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
            *(undefined4 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 2;
            pTVar7[1].m_name._M_string_length = 0;
            pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0;
            pTVar7->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_00b29d40;
            tcu::TestNode::addChild(pTStack_1e0,pTVar7);
            paVar17 = extraout_RAX_01;
          }
          uStack_218 = CONCAT44(uStack_218._4_4_,(int)CONCAT71((int7)((ulong)paVar17 >> 8),1));
          uVar27 = 0;
          do {
            puStack_2d8 = &uStack_2c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&puStack_2d8,ppTVar34,lVar11 + (long)ppTVar34);
            std::__cxx11::string::append((char *)&puStack_2d8);
            plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            puVar20 = (ulong *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar20) {
              local_328.field_2._M_allocated_capacity = *puVar20;
              local_328.field_2._8_8_ = plVar10[3];
            }
            else {
              local_328.field_2._M_allocated_capacity = *puVar20;
              local_328._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_328._M_string_length = plVar10[1];
            *plVar10 = (long)puVar20;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if (puStack_2d8 != &uStack_2c8) {
              operator_delete(puStack_2d8,uStack_2c8 + 1);
            }
            uVar31 = 0;
            bVar5 = true;
            do {
              bVar24 = bVar5;
              puStack_2d8 = &uStack_2c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&puStack_2d8,local_328._M_dataplus._M_p,
                         local_328._M_dataplus._M_p + local_328._M_string_length);
              std::__cxx11::string::append((char *)&puStack_2d8);
              pTVar7 = (TestNode *)operator_new(0xa0);
              pp_Var2 = pTVar8[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar7,(TestContext *)*pp_Var2,(char *)puStack_2d8,
                         SSBOArrayLengthTests::init::arraysSized + 1);
              pTVar7[1]._vptr_TestNode = pp_Var2;
              *(int *)&pTVar7[1].m_testCtx = iVar32;
              *(TessPrimitiveType *)((long)&pTVar7[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
              *(undefined1 *)&pTVar7[1].m_name._M_dataplus._M_p = uVar31;
              *(undefined4 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = uVar27;
              pTVar7[1].m_name._M_string_length = 0;
              pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0;
              pTVar7->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_00b29da0;
              tcu::TestNode::addChild((TestNode *)local_2e0,pTVar7);
              pTVar7 = local_2b8;
              pTVar8 = (TestNode *)operator_new(0x98);
              pp_Var2 = pTVar7[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar8,(TestContext *)*pp_Var2,(char *)puStack_2d8,
                         SSBOArrayLengthTests::init::arraysSized + 1);
              pTVar8[1]._vptr_TestNode = pp_Var2;
              pTVar8->_vptr_TestNode = (_func_int **)&PTR__SymmetricOuterEdgeCase_00b29e00;
              *(int *)&pTVar8[1].m_testCtx = iVar32;
              *(TessPrimitiveType *)((long)&pTVar8[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
              *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = uVar27;
              *(undefined1 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = uVar31;
              pTVar8[1].m_name._M_string_length = 0;
              pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
              tcu::TestNode::addChild(local_290,pTVar8);
              pTVar7 = local_2b8;
              pTVar8 = (TestNode *)operator_new(0x98);
              pp_Var2 = pTVar7[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar8,(TestContext *)*pp_Var2,(char *)puStack_2d8,
                         SSBOArrayLengthTests::init::arraysSized + 1);
              pTVar8[1]._vptr_TestNode = pp_Var2;
              *(int *)&pTVar8[1].m_testCtx = iVar32;
              *(TessPrimitiveType *)((long)&pTVar8[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
              *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = uVar27;
              *(undefined1 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = uVar31;
              pTVar8[1].m_name._M_string_length = 0;
              pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
              pTVar8->_vptr_TestNode = (_func_int **)&PTR__TessCoordComponentInvarianceCase_00b29e50
              ;
              tcu::TestNode::addChild(pTStack_268,pTVar8);
              pTVar7 = local_2b8;
              pTVar8 = (TestNode *)operator_new(0x98);
              pp_Var2 = pTVar7[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar8,(TestContext *)*pp_Var2,(char *)puStack_2d8,
                         SSBOArrayLengthTests::init::arraysSized + 1);
              pTVar8[1]._vptr_TestNode = pp_Var2;
              *(int *)&pTVar8[1].m_testCtx = iVar32;
              *(TessPrimitiveType *)((long)&pTVar8[1].m_testCtx + 4) = (TessPrimitiveType)local_308;
              *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = uVar27;
              *(undefined1 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = uVar31;
              pTVar8[1].m_name._M_string_length = 0;
              pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
              pTVar8->_vptr_TestNode = (_func_int **)&PTR__TessCoordComponentInvarianceCase_00b29f10
              ;
              tcu::TestNode::addChild((TestNode *)pUStack_220,pTVar8);
              pTVar7 = local_2b8;
              if (iVar32 != 2) {
                pTVar8 = (TestNode *)operator_new(0x98);
                pp_Var2 = pTVar7[1]._vptr_TestNode;
                tcu::TestCase::TestCase
                          ((TestCase *)pTVar8,(TestContext *)*pp_Var2,(char *)puStack_2d8,
                           SSBOArrayLengthTests::init::arraysSized + 1);
                pTVar8[1]._vptr_TestNode = pp_Var2;
                pTVar8->_vptr_TestNode =
                     (_func_int **)&PTR__OuterEdgeVertexSetIndexIndependenceCase_00b29f70;
                *(int *)&pTVar8[1].m_testCtx = iVar32;
                *(TessPrimitiveType *)((long)&pTVar8[1].m_testCtx + 4) =
                     (TessPrimitiveType)local_308;
                *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = uVar27;
                *(undefined1 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = uVar31;
                pTVar8[1].m_name._M_string_length = 0;
                pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
                tcu::TestNode::addChild(pTStack_210,pTVar8);
              }
              pTVar8 = local_2b8;
              if (puStack_2d8 != &uStack_2c8) {
                operator_delete(puStack_2d8,uStack_2c8 + 1);
              }
              uVar31 = 1;
              bVar5 = false;
            } while (bVar24);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
            uVar27 = 1;
            uVar30 = uStack_218 & 1;
            uStack_218 = uStack_218 & 0xffffffff00000000;
          } while (uVar30 != 0);
          if (ppTVar34 != &local_338) {
            operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
          }
          iVar6 = (TessPrimitiveType)local_308 + 1;
          local_308 = (TestNode *)CONCAT44(local_308._4_4_,iVar6);
        } while (iVar6 != 3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        uVar30 = (ulong)(iVar32 + 1U);
      } while (iVar32 + 1U != 3);
      pTVar7 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"user_defined_io",
                 "Test non-built-in per-patch and per-vertex inputs and outputs");
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar7[1]._vptr_TestNode = pp_Var2;
      pTStack_208 = pTVar7;
      tcu::TestNode::addChild(pTVar8,pTVar7);
      uVar30 = 0;
      do {
        pTVar7 = (TestNode *)operator_new(0x78);
        pp_Var2 = pTVar8[1]._vptr_TestNode;
        uStack_218 = uVar30;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,init::ioCases[uVar30].name,
                   init::ioCases[uVar30].description);
        pTStack_268 = (TestNode *)(init::ioCases + uVar30);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
        pTVar7[1]._vptr_TestNode = pp_Var2;
        tcu::TestNode::addChild(pTStack_208,pTVar7);
        iVar32 = 0;
        pTStack_210 = pTVar7;
        do {
          pTVar7 = pTStack_210;
          pTVar12 = (TestNode *)operator_new(0x78);
          pp_Var2 = pTVar8[1]._vptr_TestNode;
          pcVar22 = "vertex_io_array_size_query";
          if (iVar32 == 1) {
            pcVar22 = "vertex_io_array_size_shader_builtin";
          }
          local_2e0 = (BasicVariousTessLevelsPosAttrCase *)CONCAT44(local_2e0._4_4_,iVar32);
          if (iVar32 == 0) {
            pcVar22 = "vertex_io_array_size_implicit";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var2,pcVar22,
                     SSBOArrayLengthTests::init::arraysSized + 1);
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
          pTVar12[1]._vptr_TestNode = pp_Var2;
          local_290 = pTVar12;
          tcu::TestNode::addChild(pTVar7,pTVar12);
          pcVar22 = (char *)0x0;
          puVar9 = &DAT_00b2a130;
          do {
            pUVar16 = (UserDefinedIOCase *)operator_new(0x100);
            pCVar1 = (Context *)pTVar8[1]._vptr_TestNode;
            name = (char *)*puVar9;
            local_308 = (TestNode *)
                        CONCAT44(local_308._4_4_,*(IOType *)&(pTStack_268->m_name)._M_dataplus._M_p)
            ;
            puStack_2d8 = &uStack_2c8;
            lStack_2d0 = 0;
            uStack_2c8 = uStack_2c8 & 0xffffffffffffff00;
            plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            puVar20 = (ulong *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar20) {
              local_328.field_2._M_allocated_capacity = *puVar20;
              local_328.field_2._8_8_ = plVar10[3];
            }
            else {
              local_328.field_2._M_allocated_capacity = *puVar20;
              local_328._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_328._M_string_length = plVar10[1];
            *plVar10 = (long)puVar20;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
            ppTVar34 = &local_338;
            ppTVar21 = (TestNode **)(plVar10 + 2);
            if ((TestNode **)*plVar10 == ppTVar21) {
              local_338 = *ppTVar21;
              lStack_330 = plVar10[3];
            }
            else {
              local_338 = *ppTVar21;
              ppTVar34 = (TestNode **)*plVar10;
            }
            lVar11 = plVar10[1];
            *plVar10 = (long)ppTVar21;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcb8);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            psVar18 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_300.field_2._M_allocated_capacity = *psVar18;
              local_300.field_2._8_8_ = plVar10[3];
            }
            else {
              local_300.field_2._M_allocated_capacity = *psVar18;
              local_300._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_300._M_string_length = plVar10[1];
            *plVar10 = (long)psVar18;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
                      (pUVar16,pCVar1,name,pcVar22,(TessPrimitiveType)local_308,(IOType)local_2e0,
                       VERTEX_IO_ARRAY_SIZE_IMPLICIT,
                       (TessControlOutArraySize)local_300._M_dataplus._M_p,(char *)ppTVar34);
            tcu::TestNode::addChild(local_290,(TestNode *)pUVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar8 = local_2b8;
            if (ppTVar34 != &local_338) {
              operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
            if (puStack_2d8 != &uStack_2c8) {
              operator_delete(puStack_2d8,uStack_2c8 + 1);
            }
            uVar25 = (int)pcVar22 + 1;
            pcVar22 = (char *)(ulong)uVar25;
            puVar9 = puVar9 + 1;
          } while (uVar25 != 3);
          if (((TessPrimitiveType)local_308 & 0xfffffffe) == 4) {
            uVar25 = 0;
            puVar9 = &DAT_00b2a130;
            do {
              pUVar16 = (UserDefinedIOCase *)operator_new(0x100);
              pCVar1 = (Context *)pTVar8[1]._vptr_TestNode;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&stack0xfffffffffffffcb8,(char *)*puVar9,
                         (allocator<char> *)&puStack_1d0);
              plVar10 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffcb8);
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              psVar18 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_300.field_2._M_allocated_capacity = *psVar18;
                local_300.field_2._8_8_ = plVar10[3];
              }
              else {
                local_300.field_2._M_allocated_capacity = *psVar18;
                local_300._M_dataplus._M_p = (pointer)*plVar10;
              }
              _Var3._M_p = local_300._M_dataplus._M_p;
              local_300._M_string_length = plVar10[1];
              *plVar10 = (long)psVar18;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              puStack_200 = &uStack_1f0;
              lStack_1f8 = 0;
              uStack_1f0 = uStack_1f0 & 0xffffffffffffff00;
              pUStack_220 = pUVar16;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_200);
              puStack_288 = &uStack_278;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar20) {
                uStack_278 = *puVar20;
                lStack_270 = plVar10[3];
              }
              else {
                uStack_278 = *puVar20;
                puStack_288 = (ulong *)*plVar10;
              }
              lStack_280 = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_288);
              puStack_2d8 = &uStack_2c8;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar20) {
                uStack_2c8 = *puVar20;
                lStack_2c0 = plVar10[3];
              }
              else {
                uStack_2c8 = *puVar20;
                puStack_2d8 = (ulong *)*plVar10;
              }
              lStack_2d0 = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&puStack_2d8);
              pUVar16 = pUStack_220;
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
              puVar20 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar20) {
                local_328.field_2._M_allocated_capacity = *puVar20;
                local_328.field_2._8_8_ = plVar10[3];
              }
              else {
                local_328.field_2._M_allocated_capacity = *puVar20;
                local_328._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_328._M_string_length = plVar10[1];
              *plVar10 = (long)puVar20;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
                        (pUStack_220,pCVar1,_Var3._M_p,(char *)(ulong)uVar25,
                         (TessPrimitiveType)local_308,(IOType)local_2e0,
                         VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN,
                         (TessControlOutArraySize)local_328._M_dataplus._M_p,(char *)ppTVar34);
              tcu::TestNode::addChild(local_290,(TestNode *)pUVar16);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if (puStack_2d8 != &uStack_2c8) {
                operator_delete(puStack_2d8,uStack_2c8 + 1);
              }
              if (puStack_288 != &uStack_278) {
                operator_delete(puStack_288,uStack_278 + 1);
              }
              if (puStack_200 != &uStack_1f0) {
                operator_delete(puStack_200,uStack_1f0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if (ppTVar34 != &local_338) {
                operator_delete(ppTVar34,(ulong)((long)&local_338->_vptr_TestNode + 1));
              }
              uVar25 = uVar25 + 1;
              puVar9 = puVar9 + 1;
            } while (uVar25 != 3);
          }
          iVar32 = (IOType)local_2e0 + 1;
        } while (iVar32 != 3);
        uVar30 = uStack_218 + 1;
      } while (uVar30 != 6);
      pTVar7 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var2,"negative","Negative cases");
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar7[1]._vptr_TestNode = pp_Var2;
      pTVar12 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var2,"es31",
                 "GLSL ES 3.1 Negative cases");
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar12[1]._vptr_TestNode = pp_Var2;
      gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)&local_300,pTVar8->m_testCtx,
                 (RenderContext *)pTVar8[1]._vptr_TestNode[1],
                 (ContextInfo *)pTVar8[1]._vptr_TestNode[2]);
      gls::ShaderLibrary::loadShaderFile
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
                 &stack0xfffffffffffffcb8,(ShaderLibrary *)&local_300,
                 "shaders/es31/tessellation_negative_user_defined_io.test");
      if (0 < (int)((ulong)(lVar11 - (long)ppTVar34) >> 3)) {
        lVar33 = 0;
        do {
          tcu::TestNode::addChild(pTVar12,ppTVar34[lVar33]);
          lVar33 = lVar33 + 1;
        } while (lVar33 < (int)((ulong)(lVar11 - (long)ppTVar34) >> 3));
      }
      tcu::TestNode::addChild(pTVar7,pTVar12);
      if (ppTVar34 != (TestNode **)0x0) {
        operator_delete(ppTVar34,(long)local_338 - (long)ppTVar34);
      }
      gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&local_300);
      pTVar12 = (TestNode *)operator_new(0x78);
      pp_Var2 = pTVar8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var2,"es32",
                 "GLSL ES 3.2 Negative cases");
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
      pTVar12[1]._vptr_TestNode = pp_Var2;
      gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)&local_300,pTVar8->m_testCtx,
                 (RenderContext *)pTVar8[1]._vptr_TestNode[1],
                 (ContextInfo *)pTVar8[1]._vptr_TestNode[2]);
      gls::ShaderLibrary::loadShaderFile
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
                 &stack0xfffffffffffffcb8,(ShaderLibrary *)&local_300,
                 "shaders/es32/tessellation_negative_user_defined_io.test");
      if (0 < (int)((ulong)(lVar11 - (long)ppTVar34) >> 3)) {
        lVar33 = 0;
        do {
          tcu::TestNode::addChild(pTVar12,ppTVar34[lVar33]);
          lVar33 = lVar33 + 1;
        } while (lVar33 < (int)((ulong)(lVar11 - (long)ppTVar34) >> 3));
      }
      tcu::TestNode::addChild(pTVar7,pTVar12);
      if (ppTVar34 != (TestNode **)0x0) {
        operator_delete(ppTVar34,(long)local_338 - (long)ppTVar34);
      }
      gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&local_300);
      tcu::TestNode::addChild(pTStack_208,pTVar7);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TessellationTests::init (void)
{
	{
		tcu::TestCaseGroup* const queryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "Query tests");
		addChild(queryGroup);

		// new limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_patch_vertices",								"Test MAX_PATCH_VERTICES",								GL_MAX_PATCH_VERTICES,							32));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_gen_level",								"Test MAX_TESS_GEN_LEVEL",								GL_MAX_TESS_GEN_LEVEL,							64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_components",				"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",				GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS,			1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_components",			"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",			GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS,		1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_texture_image_units",				"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_texture_image_units",			"Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_output_components",				"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_patch_components",							"Test MAX_TESS_PATCH_COMPONENTS",						GL_MAX_TESS_PATCH_COMPONENTS,					120));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_total_output_components",			"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",		GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS,	2048));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_output_components",				"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_blocks",					"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",					GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,				12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_blocks",				"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",				GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_input_components",					"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_INPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_input_components",				"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counter_buffers",			"Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",			GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counter_buffers",		"Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",		GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS,	0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counters",					"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",				GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counters",				"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",				GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_image_uniforms",					"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",					GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS,				0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_image_uniforms",				"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",				GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_shader_storage_blocks",			"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",			GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_shader_storage_blocks",			"Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",		GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS,	0));

		// modified limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_uniform_buffer_bindings",						"Test MAX_UNIFORM_BUFFER_BINDINGS",						GL_MAX_UNIFORM_BUFFER_BINDINGS,					72));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_uniform_blocks",						"Test MAX_COMBINED_UNIFORM_BLOCKS",						GL_MAX_COMBINED_UNIFORM_BLOCKS,					60));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_texture_image_units",					"Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",				GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,			96));

		// combined limits
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_control_uniform_components",		"Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS,		GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,		GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS));
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_evaluation_uniform_components",		"Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS,		GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,	GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS));

		// features
		queryGroup->addChild(new PrimitiveRestartForPatchesSupportedCase(m_context, "primitive_restart_for_patches_supported", "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED"));

		// states
		queryGroup->addChild(new PatchVerticesStateCase(m_context, "patch_vertices", "Test PATCH_VERTICES"));

		// program states
		queryGroup->addChild(new TessControlOutputVerticesCase	(m_context, "tess_control_output_vertices",	"Test TESS_CONTROL_OUTPUT_VERTICES"));
		queryGroup->addChild(new TessGenModeQueryCase			(m_context, "tess_gen_mode",				"Test TESS_GEN_MODE"));
		queryGroup->addChild(new TessGenSpacingQueryCase		(m_context, "tess_gen_spacing",				"Test TESS_GEN_SPACING"));
		queryGroup->addChild(new TessGenVertexOrderQueryCase	(m_context, "tess_gen_vertex_order",		"Test TESS_GEN_VERTEX_ORDER"));
		queryGroup->addChild(new TessGenPointModeQueryCase		(m_context, "tess_gen_point_mode",			"Test TESS_GEN_POINT_MODE"));

		// resource queries
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_control_shader",	"Test REFERENCED_BY_TESS_CONTROL_SHADER",		true));
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_evaluation_shader",	"Test REFERENCED_BY_TESS_EVALUATION_SHADER",	false));
		queryGroup->addChild(new IsPerPatchQueryCase				(m_context, "is_per_patch",							"Test IS_PER_PATCH"));
	}

	{
		TestCaseGroup* const tessCoordGroup = new TestCaseGroup(m_context, "tesscoord", "Get tessellation coordinates with transform feedback and validate them");
		addChild(tessCoordGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				tessCoordGroup->addChild(new TessCoordCase(m_context,
														   (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName((SpacingMode)spacingI)).c_str(), "",
														   primitiveType, (SpacingMode)spacingI));
		}
	}

	{
		TestCaseGroup* const windingGroup = new TestCaseGroup(m_context, "winding", "Test the cw and ccw input layout qualifiers");
		addChild(windingGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			for (int windingI = 0; windingI < WINDING_LAST; windingI++)
			{
				const Winding winding = (Winding)windingI;
				windingGroup->addChild(new WindingCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getWindingShaderName(winding)).c_str(), "", primitiveType, winding));
			}
		}
	}

	{
		TestCaseGroup* const shaderInputOutputGroup = new TestCaseGroup(m_context, "shader_input_output", "Test tessellation control and evaluation shader inputs and outputs");
		addChild(shaderInputOutputGroup);

		{
			static const struct
			{
				int inPatchSize;
				int outPatchSize;
			} patchVertexCountCases[] =
			{
				{  5, 10 },
				{ 10,  5 }
			};

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(patchVertexCountCases); caseNdx++)
			{
				const int inSize	= patchVertexCountCases[caseNdx].inPatchSize;
				const int outSize	= patchVertexCountCases[caseNdx].outPatchSize;

				const string caseName = "patch_vertices_" + de::toString(inSize) + "_in_" + de::toString(outSize) + "_out";

				shaderInputOutputGroup->addChild(new PatchVertexCountCase(m_context, caseName.c_str(), "Test input and output patch vertex counts", inSize, outSize,
																		  ("data/tessellation/" + caseName + "_ref.png").c_str()));
			}
		}

		for (int caseTypeI = 0; caseTypeI < PerPatchDataCase::CASETYPE_LAST; caseTypeI++)
		{
			const PerPatchDataCase::CaseType	caseType	= (PerPatchDataCase::CaseType)caseTypeI;
			const char* const					caseName	= PerPatchDataCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new PerPatchDataCase(m_context, caseName, PerPatchDataCase::getCaseTypeDescription(caseType), caseType,
																  PerPatchDataCase::caseTypeUsesRefImageFromFile(caseType) ? (string() + "data/tessellation/" + caseName + "_ref.png").c_str() : DE_NULL));
		}

		for (int caseTypeI = 0; caseTypeI < GLPositionCase::CASETYPE_LAST; caseTypeI++)
		{
			const GLPositionCase::CaseType	caseType	= (GLPositionCase::CaseType)caseTypeI;
			const char* const				caseName	= GLPositionCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new GLPositionCase(m_context, caseName, "", caseType, "data/tessellation/gl_position_ref.png"));
		}

		shaderInputOutputGroup->addChild(new BarrierCase(m_context, "barrier", "Basic barrier usage", "data/tessellation/barrier_ref.png"));
	}

	{
		TestCaseGroup* const miscDrawGroup = new TestCaseGroup(m_context, "misc_draw", "Miscellaneous draw-result-verifying cases");
		addChild(miscDrawGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_cover_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillCoverCase(m_context,
																	   caseName.c_str(), "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
																	   primitiveType, (SpacingMode)spacingI,
																	   ("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_overlap_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillNonOverlapCase(m_context,
																			caseName.c_str(), "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
																			primitiveType, (SpacingMode)spacingI,
																			("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
		{
			const string caseName = string() + "isolines_" + getSpacingModeShaderName((SpacingMode)spacingI);

			miscDrawGroup->addChild(new IsolinesRenderCase(m_context,
														   caseName.c_str(), "Basic isolines render test",
														   (SpacingMode)spacingI,
														   ("data/tessellation/" + caseName + "_ref").c_str()));
		}
	}

	{
		TestCaseGroup* const commonEdgeGroup = new TestCaseGroup(m_context, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them");
		addChild(commonEdgeGroup);

		for (int caseTypeI = 0; caseTypeI < CommonEdgeCase::CASETYPE_LAST; caseTypeI++)
		{
			for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
			{
				const CommonEdgeCase::CaseType	caseType		= (CommonEdgeCase::CaseType)caseTypeI;
				const TessPrimitiveType			primitiveType	= (TessPrimitiveType)primitiveTypeI;
				if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
						continue;

				for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				{
					const SpacingMode	spacing		= (SpacingMode)spacingI;
					const string		caseName	= (string() + getTessPrimitiveTypeShaderName(primitiveType)
																+ "_" + getSpacingModeShaderName(spacing)
																+ (caseType == CommonEdgeCase::CASETYPE_BASIC		? ""
																 : caseType == CommonEdgeCase::CASETYPE_PRECISE		? "_precise"
																 : DE_NULL));

					commonEdgeGroup->addChild(new CommonEdgeCase(m_context, caseName.c_str(), "", primitiveType, spacing, caseType));
				}
			}
		}
	}

	{
		TestCaseGroup* const fractionalSpacingModeGroup = new TestCaseGroup(m_context, "fractional_spacing", "Test fractional spacing modes");
		addChild(fractionalSpacingModeGroup);

		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "odd",	"", SPACINGMODE_FRACTIONAL_ODD));
		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "even",	"", SPACINGMODE_FRACTIONAL_EVEN));
	}

	{
		TestCaseGroup* const primitiveDiscardGroup = new TestCaseGroup(m_context, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0");
		addChild(primitiveDiscardGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
						const SpacingMode			spacing			= (SpacingMode)spacingI;
						const Winding				winding			= (Winding)windingI;
						const bool					usePointMode	= usePointModeI != 0;

						primitiveDiscardGroup->addChild(new PrimitiveDiscardCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType)
																									  + "_" + getSpacingModeShaderName(spacing)
																									  + "_" + getWindingShaderName(winding)
																									  + (usePointMode ? "_point_mode" : "")).c_str(), "",
																				 primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		TestCaseGroup* const invarianceGroup							= new TestCaseGroup(m_context, "invariance",						"Test tessellation invariance rules");

		TestCaseGroup* const invariantPrimitiveSetGroup					= new TestCaseGroup(m_context, "primitive_set",						"Test invariance rule #1");
		TestCaseGroup* const invariantOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_division",				"Test invariance rule #2");
		TestCaseGroup* const symmetricOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_symmetry",				"Test invariance rule #3");
		TestCaseGroup* const outerEdgeVertexSetIndexIndependenceGroup	= new TestCaseGroup(m_context, "outer_edge_index_independence",		"Test invariance rule #4");
		TestCaseGroup* const invariantTriangleSetGroup					= new TestCaseGroup(m_context, "triangle_set",						"Test invariance rule #5");
		TestCaseGroup* const invariantInnerTriangleSetGroup				= new TestCaseGroup(m_context, "inner_triangle_set",				"Test invariance rule #6");
		TestCaseGroup* const invariantOuterTriangleSetGroup				= new TestCaseGroup(m_context, "outer_triangle_set",				"Test invariance rule #7");
		TestCaseGroup* const tessCoordComponentRangeGroup				= new TestCaseGroup(m_context, "tess_coord_component_range",		"Test invariance rule #8, first part");
		TestCaseGroup* const oneMinusTessCoordComponentGroup			= new TestCaseGroup(m_context, "one_minus_tess_coord_component",	"Test invariance rule #8, second part");

		addChild(invarianceGroup);
		invarianceGroup->addChild(invariantPrimitiveSetGroup);
		invarianceGroup->addChild(invariantOuterEdgeGroup);
		invarianceGroup->addChild(symmetricOuterEdgeGroup);
		invarianceGroup->addChild(outerEdgeVertexSetIndexIndependenceGroup);
		invarianceGroup->addChild(invariantTriangleSetGroup);
		invarianceGroup->addChild(invariantInnerTriangleSetGroup);
		invarianceGroup->addChild(invariantOuterTriangleSetGroup);
		invarianceGroup->addChild(tessCoordComponentRangeGroup);
		invarianceGroup->addChild(oneMinusTessCoordComponentGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
			const string				primName		= getTessPrimitiveTypeShaderName(primitiveType);
			const bool					triOrQuad		= primitiveType == TESSPRIMITIVETYPE_TRIANGLES || primitiveType == TESSPRIMITIVETYPE_QUADS;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const SpacingMode	spacing			= (SpacingMode)spacingI;
				const string		primSpacName	= primName + "_" + getSpacingModeShaderName(spacing);

				if (triOrQuad)
				{
					invariantOuterEdgeGroup->addChild		(new InvariantOuterEdgeCase			(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantTriangleSetGroup->addChild		(new InvariantTriangleSetCase		(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantInnerTriangleSetGroup->addChild(new InvariantInnerTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantOuterTriangleSetGroup->addChild(new InvariantOuterTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
				}

				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					const Winding	winding				= (Winding)windingI;
					const string	primSpacWindName	= primSpacName + "_" + getWindingShaderName(winding);

					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const bool		usePointMode			= usePointModeI != 0;
						const string	primSpacWindPointName	= primSpacWindName + (usePointMode ? "_point_mode" : "");

						invariantPrimitiveSetGroup->addChild		(new InvariantPrimitiveSetCase			(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						symmetricOuterEdgeGroup->addChild			(new SymmetricOuterEdgeCase				(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						tessCoordComponentRangeGroup->addChild		(new TessCoordComponentRangeCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						oneMinusTessCoordComponentGroup->addChild	(new OneMinusTessCoordComponentCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));

						if (triOrQuad)
							outerEdgeVertexSetIndexIndependenceGroup->addChild(new OuterEdgeVertexSetIndexIndependenceCase(m_context, primSpacWindPointName.c_str(), "",
																														   primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		static const struct
		{
			const char*					name;
			const char*					description;
			UserDefinedIOCase::IOType	ioType;
		} ioCases[] =
		{
			{ "per_patch",					"Per-patch TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_PATCH				},
			{ "per_patch_array",			"Per-patch array TCS outputs",				UserDefinedIOCase::IO_TYPE_PER_PATCH_ARRAY			},
			{ "per_patch_block",			"Per-patch TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK			},
			{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
			{ "per_vertex",					"Per-vertex TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_VERTEX				},
			{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK			},
		};

		TestCaseGroup* const userDefinedIOGroup = new TestCaseGroup(m_context, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs");
		addChild(userDefinedIOGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ioCases); ++ndx)
		{
			TestCaseGroup* const ioTypeGroup = new TestCaseGroup(m_context, ioCases[ndx].name, ioCases[ndx].description);
			userDefinedIOGroup->addChild(ioTypeGroup);

			for (int vertexArraySizeI = 0; vertexArraySizeI < UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_LAST; vertexArraySizeI++)
			{
				const UserDefinedIOCase::VertexIOArraySize	vertexArraySize			= (UserDefinedIOCase::VertexIOArraySize)vertexArraySizeI;
				TestCaseGroup* const						vertexArraySizeGroup	= new TestCaseGroup(m_context,
																										vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_IMPLICIT
																											? "vertex_io_array_size_implicit"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN
																											? "vertex_io_array_size_shader_builtin"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY
																											? "vertex_io_array_size_query"
																									  : DE_NULL,
																									    "");
				ioTypeGroup->addChild(vertexArraySizeGroup);

				for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
				{
					const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
					vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, getTessPrimitiveTypeShaderName(primitiveType), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_IMPLICIT,
																		 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
				}

				if (ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX
					|| ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK)
				{
					for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
					{
						const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
						vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, (string(getTessPrimitiveTypeShaderName(primitiveType)) + "_explicit_tcs_out_size").c_str(), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT,
																			 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
					}
				}
			}
		}

		{
			de::MovePtr<TestCaseGroup>	negativeGroup	(new TestCaseGroup(m_context, "negative", "Negative cases"));

			{
				de::MovePtr<TestCaseGroup>			es31Group		(new TestCaseGroup(m_context, "es31", "GLSL ES 3.1 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es31Group->addChild(children[i]);

				negativeGroup->addChild(es31Group.release());
			}

			{
				de::MovePtr<TestCaseGroup>			es32Group		(new TestCaseGroup(m_context, "es32", "GLSL ES 3.2 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es32Group->addChild(children[i]);

				negativeGroup->addChild(es32Group.release());
			}

			userDefinedIOGroup->addChild(negativeGroup.release());
		}
	}
}